

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O2

void __thiscall
solitaire::events::EventsProcessorTests::acceptLeftButtonDownOnTableauPileCard
          (EventsProcessorTests *this,PileId *id,uint cardIndex,MouseLeftButtonDown *event)

{
  TypedExpectation<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
  *this_00;
  TypedExpectation<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)> *this_01;
  ReturnAction<unsigned_int> local_98;
  Action<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)> local_88;
  MatcherBase<const_solitaire::geometry::Position_&> local_68;
  MockSpec<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)> local_50;
  PileId local_2c;
  
  local_2c = (PileId)id->t;
  testing::Matcher<solitaire::piles::PileId>::Matcher
            ((Matcher<solitaire::piles::PileId> *)&local_68,&local_2c);
  ContextMock::gmock_getTableauPileCollider
            ((MockSpec<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
              *)&local_50,&(this->contextMock).super_ContextMock,
             (Matcher<solitaire::piles::PileId> *)&local_68);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
            ::InternalExpectedAt
                      ((MockSpec<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
                        *)&local_50,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                       ,0x74,"contextMock","getTableauPileCollider(id)");
  local_98.value_.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&this->tableauPileColliderMock;
  testing::internal::ReturnRefAction::operator_cast_to_Action
            ((Action<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
              *)&local_88,(ReturnRefAction *)&local_98);
  testing::internal::
  TypedExpectation<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
  ::WillOnce(this_00,(Action<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
                      *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  testing::internal::MatcherBase<solitaire::piles::PileId>::~MatcherBase
            ((MatcherBase<solitaire::piles::PileId> *)&local_50.matchers_);
  testing::internal::MatcherBase<solitaire::piles::PileId>::~MatcherBase
            ((MatcherBase<solitaire::piles::PileId> *)&local_68);
  testing::Matcher<const_solitaire::geometry::Position_&>::Matcher
            ((Matcher<const_solitaire::geometry::Position_&> *)&local_68,&event->position);
  colliders::TableauPileColliderMock::gmock_tryGetCollidedCardIndex
            (&local_50,&(this->tableauPileColliderMock).super_TableauPileColliderMock,
             (Matcher<const_solitaire::geometry::Position_&> *)&local_68);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)>::
            InternalExpectedAt(&local_50,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                               ,0x76,"tableauPileColliderMock",
                               "tryGetCollidedCardIndex(event.position)");
  testing::internal::ReturnAction<unsigned_int>::ReturnAction(&local_98,cardIndex);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_88,(ReturnAction *)&local_98);
  testing::internal::
  TypedExpectation<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)>::WillOnce
            (this_01,&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.value_.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  testing::internal::MatcherBase<const_solitaire::geometry::Position_&>::~MatcherBase
            ((MatcherBase<const_solitaire::geometry::Position_&> *)&local_50.matchers_);
  testing::internal::MatcherBase<const_solitaire::geometry::Position_&>::~MatcherBase(&local_68);
  return;
}

Assistant:

void acceptLeftButtonDownOnTableauPileCard(
        const PileId id, const unsigned cardIndex, const MouseLeftButtonDown& event)
    {
        EXPECT_CALL(contextMock, getTableauPileCollider(id))
            .WillOnce(ReturnRef(tableauPileColliderMock));
        EXPECT_CALL(tableauPileColliderMock, tryGetCollidedCardIndex(event.position))
            .WillOnce(Return(cardIndex));
    }